

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O1

int vardata_add_feature(vardata *data,char *name,char *description)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  vardata_feature *pvVar6;
  
  if (data->validated == 0) {
    iVar2 = symtab_put(data->symtab,name,0,data->featuresnum);
    if (iVar2 == -1) {
      iVar2 = -1;
    }
    else {
      iVar2 = data->featuresnum;
      pcVar4 = strdup(name);
      if (description == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = strdup(description);
      }
      iVar1 = data->featuresmax;
      if (iVar1 <= iVar2) {
        iVar3 = 0x10;
        if (iVar1 != 0) {
          iVar3 = iVar1 * 2;
        }
        data->featuresmax = iVar3;
        pvVar6 = (vardata_feature *)realloc(data->features,(long)iVar3 << 6);
        data->features = pvVar6;
      }
      pvVar6 = data->features;
      iVar1 = data->featuresnum;
      data->featuresnum = iVar1 + 1;
      pvVar6[iVar1].name = pcVar4;
      pvVar6[iVar1].description = pcVar5;
      pvVar6[iVar1].ifmask = (uint32_t *)0x0;
      (&pvVar6[iVar1].ifmask)[1] = (uint32_t *)0x0;
      pvVar6[iVar1].implies = (int *)0x0;
      (&pvVar6[iVar1].implies)[1] = (int *)0x0;
      pvVar6[iVar1].conflicts = (int *)0x0;
      (&pvVar6[iVar1].conflicts)[1] = (int *)0x0;
    }
    return iVar2;
  }
  abort();
}

Assistant:

int vardata_add_feature(struct vardata *data, const char *name, const char *description) {
	if (data->validated)
		abort();
	if (symtab_put(data->symtab, name, VARDATA_ST_FEATURE, data->featuresnum) == -1)
		return -1;
	int res = data->featuresnum;
	struct vardata_feature new = { strdup(name) };
	if (description)
		new.description = strdup(description);
	ADDARRAY(data->features, new);
	return res;
}